

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_rule_cache.cc
# Opt level: O3

QuadRule * __thiscall lf::quad::QuadRuleCache::Get(QuadRuleCache *this,RefEl ref_el,uint degree)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  double *pdVar4;
  double *__ptr;
  Index IVar5;
  Index IVar6;
  Index IVar7;
  ulong uVar8;
  reference pQVar9;
  _Deque_iterator<lf::quad::QuadRule,_lf::quad::QuadRule_&,_lf::quad::QuadRule_*> *this_00;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  Index local_198;
  Index IStack_190;
  double *local_188;
  Index local_180;
  
  uVar8 = (ulong)((uint)ref_el.type_ * 0x50);
  this_00 = (_Deque_iterator<lf::quad::QuadRule,_lf::quad::QuadRule_&,_lf::quad::QuadRule_*> *)
            ((long)&(this->cache_)._M_elems[0].
                    super__Deque_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur + uVar8);
  lVar3 = *(long *)((long)&(this->cache_)._M_elems[0].
                           super__Deque_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node + uVar8);
  if ((*(long *)((long)&(this->cache_)._M_elems[0].
                        super__Deque_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_last + uVar8) -
       (long)this_00->_M_cur >> 4) * -0x5555555555555555 +
      (*(long *)((long)&(this->cache_)._M_elems[0].
                        super__Deque_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_cur + uVar8) -
       *(long *)((long)&(this->cache_)._M_elems[0].
                        super__Deque_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_first + uVar8) >> 4) *
      -0x5555555555555555 +
      ((lVar3 - *(long *)((long)&(this->cache_)._M_elems[0].
                                 super__Deque_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_node + uVar8) >> 3) +
       -1 + (ulong)(lVar3 == 0)) * 10 < (ulong)(degree + 1)) {
    std::deque<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>::resize
              ((deque<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *)
               ((long)&(this->cache_)._M_elems[0].
                       super__Deque_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>.
                       _M_impl.super__Deque_impl_data._M_map + uVar8),(ulong)(degree + 1));
  }
  pQVar9 = std::_Deque_iterator<lf::quad::QuadRule,_lf::quad::QuadRule_&,_lf::quad::QuadRule_*>::
           operator[](this_00,(ulong)degree);
  if ((int)(pQVar9->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols == 0) {
    make_QuadRule((QuadRule *)local_1a8,ref_el,degree);
    (pQVar9->ref_el_).type_ = local_1a8[0];
    pQVar9->degree_ = local_1a8._4_4_;
    pdVar4 = (pQVar9->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (pQVar9->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_1a8._8_8_;
    IVar6 = (pQVar9->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    IVar7 = (pQVar9->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (pQVar9->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_198;
    (pQVar9->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = IStack_190;
    __ptr = (pQVar9->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data;
    (pQVar9->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = local_188;
    IVar5 = (pQVar9->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    (pQVar9->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = local_180;
    local_1a8._8_8_ = pdVar4;
    local_198 = IVar6;
    IStack_190 = IVar7;
    local_188 = __ptr;
    local_180 = IVar5;
    free(__ptr);
    free((void *)local_1a8._8_8_);
  }
  if (degree <= pQVar9->degree_) {
    return pQVar9;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"something is horribly wrong.",0x1c);
  paVar1 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"qr.Degree() >= degree","");
  paVar2 = &local_208.field_2;
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/quad_rule_cache.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1e8,&local_208,0x18,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"false","");
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/quad_rule_cache.cc"
             ,"");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  base::AssertionFailed(&local_1e8,&local_208,0x18,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  abort();
}

Assistant:

const QuadRule& QuadRuleCache::Get(base::RefEl ref_el, unsigned degree) const {
  LF_ASSERT_MSG(degree >= 0, "degree must be non-negative.");
  auto& vector = cache_[ref_el.Id()];
  if (vector.size() < degree + 1) {
    vector.resize(degree + 1);
  }
  auto& qr = vector[degree];
  if (qr.NumPoints() == 0) {
    qr = make_QuadRule(ref_el, degree);
  }
  LF_ASSERT_MSG(qr.Degree() >= degree, "something is horribly wrong.");
  return qr;
}